

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImBezierCubicClosestPointCasteljauStep
               (ImVec2 *p,ImVec2 *p_closest,ImVec2 *p_last,float *p_closest_dist2,float x1,float y1,
               float x2,float y2,float x3,float y3,float x4,float y4,float tess_tol,int level)

{
  ImVec2 IVar1;
  uint uVar2;
  float *p_closest_dist2_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float in_stack_00000010;
  float in_stack_00000018;
  
  p_closest_dist2_00 = (float *)((ulong)p_closest_dist2 & 0xffffffff);
  iVar3 = 10;
  if (10 < (int)p_closest_dist2) {
    iVar3 = (int)p_closest_dist2;
  }
  while( true ) {
    uVar2 = (int)p_closest_dist2_00 + 1;
    p_closest_dist2_00 = (float *)(ulong)uVar2;
    fVar6 = tess_tol - x2;
    fVar7 = in_stack_00000010 - y2;
    fVar13 = fVar7 * (x3 - tess_tol) - fVar6 * (y3 - in_stack_00000010);
    fVar14 = fVar7 * (x4 - tess_tol) - fVar6 * (y4 - in_stack_00000010);
    uVar4 = -(uint)(-fVar13 <= fVar13);
    uVar5 = -(uint)(-fVar14 <= fVar14);
    fVar13 = (float)(~uVar5 & (uint)-fVar14 | (uint)fVar14 & uVar5) +
             (float)(~uVar4 & (uint)-fVar13 | (uint)fVar13 & uVar4);
    if (fVar13 * fVar13 < (fVar6 * fVar6 + fVar7 * fVar7) * in_stack_00000018) {
      fVar6 = (*p_closest).x;
      fVar7 = (*p_closest).y;
      fVar14 = tess_tol - fVar6;
      fVar10 = in_stack_00000010 - fVar7;
      fVar13 = (x1 - fVar6) * fVar14 + (y1 - fVar7) * fVar10;
      if (0.0 <= fVar13) {
        fVar9 = fVar14 * fVar14 + fVar10 * fVar10;
        IVar8.y = in_stack_00000010;
        IVar8.x = tess_tol;
        if (fVar13 <= fVar9) {
          auVar11._0_4_ = fVar14 * fVar13;
          auVar11._4_4_ = fVar10 * fVar13;
          auVar11._8_4_ = fVar13 * 0.0;
          auVar11._12_4_ = fVar13 * 0.0;
          auVar12._4_4_ = fVar9;
          auVar12._0_4_ = fVar9;
          auVar12._8_4_ = fVar9;
          auVar12._12_4_ = fVar9;
          auVar12 = divps(auVar11,auVar12);
          IVar8.y = fVar7 + auVar12._4_4_;
          IVar8.x = fVar6 + auVar12._0_4_;
        }
      }
      else {
        IVar8 = *p_closest;
      }
      fVar7 = x1 - IVar8.x;
      fVar6 = y1 - IVar8.y;
      fVar6 = fVar7 * fVar7 + fVar6 * fVar6;
      if (fVar6 < p_last->x) {
        *p = IVar8;
        p_last->x = fVar6;
      }
      IVar1.y = in_stack_00000010;
      IVar1.x = tess_tol;
      *p_closest = IVar1;
      return;
    }
    if (uVar2 - iVar3 == 1) break;
    fVar6 = (x4 + x3) * 0.5;
    fVar13 = (y4 + y3) * 0.5;
    fVar14 = (x3 + x2) * 0.5;
    x4 = (tess_tol + x4) * 0.5;
    fVar7 = (fVar6 + fVar14) * 0.5;
    x3 = (fVar6 + x4) * 0.5;
    fVar10 = (y3 + y2) * 0.5;
    y4 = (in_stack_00000010 + y4) * 0.5;
    fVar6 = (fVar13 + fVar10) * 0.5;
    y3 = (fVar13 + y4) * 0.5;
    fVar13 = (x3 + fVar7) * 0.5;
    ImBezierCubicClosestPointCasteljauStep
              (p,p_closest,p_last,p_closest_dist2_00,x1,y1,x2,y2,fVar14,fVar10,fVar7,fVar6,fVar13,
               level);
    y2 = (y3 + fVar6) * 0.5;
    x2 = fVar13;
  }
  return;
}

Assistant:

static void ImBezierCubicClosestPointCasteljauStep(const ImVec2& p, ImVec2& p_closest, ImVec2& p_last, float& p_closest_dist2, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        ImVec2 p_current(x4, y4);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2)*0.5f,       y12 = (y1 + y2)*0.5f;
        float x23 = (x2 + x3)*0.5f,       y23 = (y2 + y3)*0.5f;
        float x34 = (x3 + x4)*0.5f,       y34 = (y3 + y4)*0.5f;
        float x123 = (x12 + x23)*0.5f,    y123 = (y12 + y23)*0.5f;
        float x234 = (x23 + x34)*0.5f,    y234 = (y23 + y34)*0.5f;
        float x1234 = (x123 + x234)*0.5f, y1234 = (y123 + y234)*0.5f;
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}